

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

C __thiscall dg::vr::ValueRelations::getAnyConst(ValueRelations *this,Handle h)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  C pCVar3;
  key_type local_8;
  
  local_8._M_data = h;
  cVar1 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&(this->bucketToVals)._M_t,&local_8);
  p_Var2 = cVar1._M_node[1]._M_parent;
  while( true ) {
    if (p_Var2 == cVar1._M_node[1]._M_left) {
      return (C)0x0;
    }
    pCVar3 = *(C *)p_Var2;
    if (pCVar3[0x10] != (ConstantInt)0x10) {
      pCVar3 = (C)0x0;
    }
    if (pCVar3 != (C)0x0) break;
    p_Var2 = (_Base_ptr)&p_Var2->_M_parent;
  }
  return pCVar3;
}

Assistant:

ValueRelations::C ValueRelations::getAnyConst(Handle h) const {
    for (V val : bucketToVals.find(h)->second) {
        if (C c = llvm::dyn_cast<BareC>(val))
            return c;
    }
    return nullptr;
}